

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# grparser.c
# Opt level: O1

int ngp_keyword_all_write(NGP_HDU *ngph,fitsfile *ffp,int mode)

{
  NGP_TOKEN *pNVar1;
  int iVar2;
  char *pcVar3;
  char *keyname;
  char *comm;
  long lVar4;
  long lVar5;
  int r;
  int ib;
  long l;
  char buf [200];
  int local_114;
  fitsfile *local_110;
  int local_104;
  long local_100;
  char local_f8 [200];
  
  local_114 = 0x16a;
  if (ffp != (fitsfile *)0x0 && ngph != (NGP_HDU *)0x0) {
    local_114 = 0;
    local_110 = ffp;
    if (0 < ngph->tokcnt) {
      lVar5 = 0x50;
      lVar4 = 0;
      do {
        pNVar1 = ngph->tok;
        iVar2 = ngp_keyword_is_write((NGP_TOKEN *)(pNVar1->name + lVar5 + -0x54));
        if (((mode & 1U) == 0) && (iVar2 != 0)) {
          local_114 = 0;
          if ((iVar2 == 0x170) && (pNVar1->name[lVar5 + 0xc] != '\0')) {
            ffmcom(local_110,pNVar1->name + lVar5 + -0x50,pNVar1->name + lVar5 + 0xc,&local_114);
          }
          goto switchD_001be9de_default;
        }
        local_114 = iVar2;
        switch(((NGP_TOKEN *)(pNVar1->name + lVar5 + -0x54))->type) {
        case 1:
          keyname = pNVar1->name + lVar5 + -4 + -0x4c;
          local_104 = (int)pNVar1->name[lVar5 + -4];
          comm = pNVar1->name + lVar5 + 0xc;
          iVar2 = 0xe;
          pcVar3 = (char *)&local_104;
          goto LAB_001bea6b;
        case 2:
          ffpkls(local_110,pNVar1->name + lVar5 + -4 + -0x4c,*(char **)(pNVar1->name + lVar5 + -4),
                 pNVar1->name + lVar5 + 0xc,&local_114);
          break;
        case 3:
          keyname = pNVar1->name + lVar5 + -4 + -0x4c;
          local_100 = (long)*(int *)(pNVar1->name + lVar5 + -4);
          comm = pNVar1->name + lVar5 + 0xc;
          iVar2 = 0x29;
          pcVar3 = (char *)&local_100;
          goto LAB_001bea6b;
        case 4:
          pcVar3 = pNVar1->name + lVar5 + -4;
          keyname = pNVar1->name + lVar5 + -0x50;
          comm = pNVar1->name + lVar5 + 0xc;
          iVar2 = 0x52;
          goto LAB_001bea6b;
        case 5:
          pcVar3 = pNVar1->name + lVar5 + -4;
          keyname = pNVar1->name + lVar5 + -0x50;
          comm = pNVar1->name + lVar5 + 0xc;
          iVar2 = 0xa3;
LAB_001bea6b:
          ffpky(local_110,iVar2,keyname,pcVar3,comm,&local_114);
          break;
        case 6:
          ffpkyu(local_110,pNVar1->name + lVar5 + -0x50,pNVar1->name + lVar5 + 0xc,&local_114);
          break;
        case 7:
          pcVar3 = pNVar1->name + lVar5 + -0x50;
          iVar2 = strcmp("HISTORY",pcVar3);
          if (iVar2 == 0) {
            ffphis(local_110,pNVar1->name + lVar5 + 0xc,&local_114);
          }
          else {
            iVar2 = strcmp("COMMENT",pcVar3);
            if (iVar2 == 0) {
              ffpcom(local_110,pNVar1->name + lVar5 + 0xc,&local_114);
            }
            else {
              snprintf(local_f8,200,"%-8.8s%s",pcVar3);
              ffprec(local_110,local_f8,&local_114);
            }
          }
        }
switchD_001be9de_default:
        if (local_114 != 0) {
          return local_114;
        }
        lVar4 = lVar4 + 1;
        lVar5 = lVar5 + 0xb0;
      } while (lVar4 < ngph->tokcnt);
    }
    ffrdef(local_110,&local_114);
  }
  return local_114;
}

Assistant:

int     ngp_keyword_all_write(NGP_HDU *ngph, fitsfile *ffp, int mode)
 { int		i, r, ib;
   char		buf[200];
   long		l;


   if (NULL == ngph) return(NGP_NUL_PTR);
   if (NULL == ffp) return(NGP_NUL_PTR);
   r = NGP_OK;
   
   for (i=0; i<ngph->tokcnt; i++)
    { r = ngp_keyword_is_write(&(ngph->tok[i]));
      if ((NGP_REALLY_ALL & mode) || (NGP_OK == r))
        { switch (ngph->tok[i].type)
           { case NGP_TTYPE_BOOL:
			ib = ngph->tok[i].value.b;
			fits_write_key(ffp, TLOGICAL, ngph->tok[i].name, &ib, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_STRING:
			fits_write_key_longstr(ffp, ngph->tok[i].name, ngph->tok[i].value.s, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_INT:
			l = ngph->tok[i].value.i;	/* bugfix - 22-Jan-99, BO - nonalignment of OSF/Alpha */
			fits_write_key(ffp, TLONG, ngph->tok[i].name, &l, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_REAL:
			fits_write_key(ffp, TDOUBLE, ngph->tok[i].name, &(ngph->tok[i].value.d), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_COMPLEX:
			fits_write_key(ffp, TDBLCOMPLEX, ngph->tok[i].name, &(ngph->tok[i].value.c), ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_NULL:
			fits_write_key_null(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
			break;
             case NGP_TTYPE_RAW:
			if (0 == strcmp("HISTORY", ngph->tok[i].name))
			  { fits_write_history(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			if (0 == strcmp("COMMENT", ngph->tok[i].name))
			  { fits_write_comment(ffp, ngph->tok[i].comment, &r);
			    break;
			  }
			snprintf(buf,200, "%-8.8s%s", ngph->tok[i].name, ngph->tok[i].comment);
			fits_write_record(ffp, buf, &r);
                        break;
           }
        }
      else if (NGP_BAD_ARG == r) /* enhancement 10 dec 2003, James Peachey: template comments replace defaults */
        { r = NGP_OK;						/* update comments of special keywords like TFORM */
          if (ngph->tok[i].comment && *ngph->tok[i].comment)	/* do not update with a blank comment */
            { fits_modify_comment(ffp, ngph->tok[i].name, ngph->tok[i].comment, &r);
            }
        }
      else /* other problem, typically a blank token */
        { r = NGP_OK;						/* skip this token, but continue */
        }
      if (r) return(r);
    }
     
   fits_set_hdustruc(ffp, &r);				/* resync cfitsio */
   return(r);
 }